

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_address.cpp
# Opt level: O1

bool __thiscall
zmq::tcp_address_mask_t::match_address(tcp_address_mask_t *this,sockaddr *ss_,socklen_t ss_len_)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  void *__s1;
  char *errmsg_;
  size_t __n;
  
  if (((ss_len_ < 0x10) || (ss_ == (sockaddr *)0x0)) || (this->_address_mask == -1)) {
    match_address();
  }
  if (ss_->sa_family != (this->_network_address).generic.sa_family) {
    return false;
  }
  if (this->_address_mask < 1) {
    return true;
  }
  if (ss_->sa_family == 10) {
    if (ss_len_ == 0x1c) {
      iVar4 = 0x80;
      lVar5 = 8;
      goto LAB_001e4193;
    }
    match_address();
    iVar4 = 0x80;
    lVar5 = 8;
    errmsg_ = "ss_len_ == sizeof (struct sockaddr_in6)";
  }
  else {
    if (ss_len_ == 0x10) {
      iVar4 = 0x20;
      lVar5 = 4;
      goto LAB_001e4193;
    }
    match_address();
    iVar4 = 0x20;
    lVar5 = 4;
    errmsg_ = "ss_len_ == sizeof (struct sockaddr_in)";
  }
  fflush(_stderr);
  zmq_abort(errmsg_);
LAB_001e4193:
  __s1 = (void *)((long)&this->_network_address + lVar5);
  if (this->_address_mask < iVar4) {
    iVar4 = this->_address_mask;
  }
  iVar1 = iVar4 + 7;
  if (-1 < iVar4) {
    iVar1 = iVar4;
  }
  __n = (size_t)(iVar1 >> 3);
  iVar2 = bcmp(__s1,ss_->sa_data + lVar5 + -2,__n);
  if (iVar2 == 0) {
    uVar3 = 0xff << (8 - ((char)iVar4 - ((byte)iVar1 & 0xf8)) & 0x1f);
    if ((char)uVar3 == '\0') {
      return true;
    }
    if ((uVar3 & (byte)(*(byte *)((long)__s1 + __n) ^ (ss_->sa_data + lVar5 + -2)[__n])) == 0) {
      return true;
    }
  }
  return false;
}

Assistant:

bool zmq::tcp_address_mask_t::match_address (const struct sockaddr *ss_,
                                             const socklen_t ss_len_) const
{
    zmq_assert (_address_mask != -1 && ss_ != NULL
                && ss_len_
                     >= static_cast<socklen_t> (sizeof (struct sockaddr)));

    if (ss_->sa_family != _network_address.generic.sa_family)
        return false;

    if (_address_mask > 0) {
        int mask;
        const uint8_t *our_bytes, *their_bytes;
        if (ss_->sa_family == AF_INET6) {
            zmq_assert (ss_len_ == sizeof (struct sockaddr_in6));
            their_bytes = reinterpret_cast<const uint8_t *> (
              &((reinterpret_cast<const struct sockaddr_in6 *> (ss_))
                  ->sin6_addr));
            our_bytes = reinterpret_cast<const uint8_t *> (
              &_network_address.ipv6.sin6_addr);
            mask = sizeof (struct in6_addr) * 8;
        } else {
            zmq_assert (ss_len_ == sizeof (struct sockaddr_in));
            their_bytes = reinterpret_cast<const uint8_t *> (&(
              (reinterpret_cast<const struct sockaddr_in *> (ss_))->sin_addr));
            our_bytes = reinterpret_cast<const uint8_t *> (
              &_network_address.ipv4.sin_addr);
            mask = sizeof (struct in_addr) * 8;
        }
        if (_address_mask < mask)
            mask = _address_mask;

        const size_t full_bytes = mask / 8;
        if (memcmp (our_bytes, their_bytes, full_bytes) != 0)
            return false;

        const uint8_t last_byte_bits = 0xffU << (8 - mask % 8);
        if (last_byte_bits) {
            if ((their_bytes[full_bytes] & last_byte_bits)
                != (our_bytes[full_bytes] & last_byte_bits))
                return false;
        }
    }

    return true;
}